

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

void av1_set_dec_model_op_parameters(aom_dec_model_op_parameters_t *op_params)

{
  op_params->decoder_model_param_present_flag = 1;
  op_params->decoder_buffer_delay = 45000;
  op_params->encoder_buffer_delay = 45000;
  op_params->low_delay_mode_flag = 0;
  op_params->display_model_param_present_flag = 1;
  op_params->initial_display_delay = 8;
  return;
}

Assistant:

void av1_set_dec_model_op_parameters(aom_dec_model_op_parameters_t *op_params) {
  op_params->decoder_model_param_present_flag = 1;
  op_params->decoder_buffer_delay = 90000 >> 1;  //  0.5 s
  op_params->encoder_buffer_delay = 90000 >> 1;  //  0.5 s
  op_params->low_delay_mode_flag = 0;
  op_params->display_model_param_present_flag = 1;
  op_params->initial_display_delay = 8;  // 8 frames delay
}